

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O0

MPP_RET mpp_parser_control(Parser prs,MpiCmd cmd,void *para)

{
  ParserImpl *p;
  void *para_local;
  MpiCmd cmd_local;
  Parser prs_local;
  
  if (prs == (Parser)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input\n","mpp_parser_control");
    prs_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if (*(long *)(*prs + 0x48) == 0) {
    prs_local._4_4_ = MPP_OK;
  }
  else {
    prs_local._4_4_ = (**(code **)(*prs + 0x48))(*(undefined8 *)((long)prs + 8),cmd,para);
  }
  return prs_local._4_4_;
}

Assistant:

MPP_RET mpp_parser_control(Parser prs, MpiCmd cmd, void *para)
{
    if (NULL == prs) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ParserImpl *p = (ParserImpl *)prs;
    if (!p->api->control)
        return MPP_OK;

    return p->api->control(p->ctx, cmd, para);
}